

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_leftShift_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  auVar6._0_4_ = (int)fVar1;
  auVar6._4_4_ = (int)fVar2;
  auVar6._8_4_ = (int)fVar3;
  auVar6._12_4_ = (int)fVar4;
  auVar12._0_4_ = auVar6._0_4_ >> 0x1f;
  auVar12._4_4_ = auVar6._4_4_ >> 0x1f;
  auVar12._8_4_ = auVar6._8_4_ >> 0x1f;
  auVar12._12_4_ = auVar6._12_4_ >> 0x1f;
  auVar5._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar5._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar5._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar5._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar6 = auVar5 & auVar12 | auVar6;
  auVar10._0_12_ = auVar6._4_12_;
  auVar10._12_4_ = auVar6._0_4_;
  uVar9 = auVar6._4_4_ * (int)(float)((int)c->in[1].m_data[3] * 0x800000 + 0x3f800000);
  uVar11 = (uint)((auVar10._8_8_ & 0xffffffff) *
                 (ulong)(uint)(int)(float)((int)c->in[1].m_data[1] * 0x800000 + 0x3f800000));
  uVar7 = (int)(float)((int)c->in[1].m_data[2] * 0x800000 + 0x3f800000) * auVar6._8_4_;
  uVar8 = (int)(float)((int)c->in[1].m_data[0] * 0x800000 + 0x3f800000) * auVar6._0_4_;
  (c->color).m_data[0] =
       ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar9 & 0xffff | 0x4b000000);
  (c->color).m_data[1] =
       ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar7 & 0xffff | 0x4b000000);
  (c->color).m_data[2] =
       ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar11 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[3] =
       ((float)(uVar8 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar8 & 0xffff | 0x4b000000);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }